

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.h
# Opt level: O3

void __thiscall
winmd::reader::cache::add_type_to_members(cache *this,TypeDef *type,namespace_members *members)

{
  pointer *ppTVar1;
  table_base *this_00;
  uint32_t uVar2;
  undefined4 uVar3;
  category cVar4;
  uint uVar5;
  vector<winmd::reader::TypeDef,std::allocator<winmd::reader::TypeDef>> *pvVar6;
  iterator iVar7;
  CustomAttribute CVar8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_48;
  string_view local_28;
  
  cVar4 = get_category(type);
  switch(cVar4) {
  case interface_type:
    iVar7._M_current =
         (members->interfaces).
         super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>._M_impl
         .super__Vector_impl_data._M_finish;
    if (iVar7._M_current ==
        (members->interfaces).
        super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      pvVar6 = (vector<winmd::reader::TypeDef,std::allocator<winmd::reader::TypeDef>> *)
               &members->interfaces;
LAB_00164fd1:
      std::vector<winmd::reader::TypeDef,std::allocator<winmd::reader::TypeDef>>::
      _M_realloc_insert<winmd::reader::TypeDef_const&>(pvVar6,iVar7,type);
      return;
    }
    uVar2 = (type->super_row_base<winmd::reader::TypeDef>).m_index;
    uVar3 = *(undefined4 *)&(type->super_row_base<winmd::reader::TypeDef>).field_0xc;
    ((iVar7._M_current)->super_row_base<winmd::reader::TypeDef>).m_table =
         (type->super_row_base<winmd::reader::TypeDef>).m_table;
    ((iVar7._M_current)->super_row_base<winmd::reader::TypeDef>).m_index = uVar2;
    *(undefined4 *)&((iVar7._M_current)->super_row_base<winmd::reader::TypeDef>).field_0xc = uVar3;
    ppTVar1 = &(members->interfaces).
               super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppTVar1 = *ppTVar1 + 1;
    break;
  case class_type:
    this_00 = (type->super_row_base<winmd::reader::TypeDef>).m_table;
    uVar5 = table_base::get_value<unsigned_int>
                      (this_00,(type->super_row_base<winmd::reader::TypeDef>).m_index,3);
    local_28._M_str = (char *)CONCAT44(local_28._M_str._4_4_,uVar5);
    local_28._M_len = (size_t)this_00;
    get_type_namespace_and_name(&local_48,(coded_index<winmd::reader::TypeDefOrRef> *)&local_28);
    if ((((local_48.first._M_len == 6) &&
         ((short)*(int *)((long)local_48.first._M_str + 4) == 0x6d65 &&
          *(int *)local_48.first._M_str == 0x74737953)) && (local_48.second._M_len == 9)) &&
       ((char)*(long *)((long)local_48.second._M_str + 8) == 'e' &&
        *(long *)local_48.second._M_str == 0x7475626972747441)) {
      iVar7._M_current =
           (members->attributes).
           super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar7._M_current !=
          (members->attributes).
          super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        uVar2 = (type->super_row_base<winmd::reader::TypeDef>).m_index;
        uVar3 = *(undefined4 *)&(type->super_row_base<winmd::reader::TypeDef>).field_0xc;
        ((iVar7._M_current)->super_row_base<winmd::reader::TypeDef>).m_table =
             (type->super_row_base<winmd::reader::TypeDef>).m_table;
        ((iVar7._M_current)->super_row_base<winmd::reader::TypeDef>).m_index = uVar2;
        *(undefined4 *)&((iVar7._M_current)->super_row_base<winmd::reader::TypeDef>).field_0xc =
             uVar3;
        ppTVar1 = &(members->attributes).
                   super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppTVar1 = *ppTVar1 + 1;
        return;
      }
      pvVar6 = (vector<winmd::reader::TypeDef,std::allocator<winmd::reader::TypeDef>> *)
               &members->attributes;
    }
    else {
      iVar7._M_current =
           (members->classes).
           super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar7._M_current !=
          (members->classes).
          super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        uVar2 = (type->super_row_base<winmd::reader::TypeDef>).m_index;
        uVar3 = *(undefined4 *)&(type->super_row_base<winmd::reader::TypeDef>).field_0xc;
        ((iVar7._M_current)->super_row_base<winmd::reader::TypeDef>).m_table =
             (type->super_row_base<winmd::reader::TypeDef>).m_table;
        ((iVar7._M_current)->super_row_base<winmd::reader::TypeDef>).m_index = uVar2;
        *(undefined4 *)&((iVar7._M_current)->super_row_base<winmd::reader::TypeDef>).field_0xc =
             uVar3;
        ppTVar1 = &(members->classes).
                   super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppTVar1 = *ppTVar1 + 1;
        return;
      }
      pvVar6 = (vector<winmd::reader::TypeDef,std::allocator<winmd::reader::TypeDef>> *)
               &members->classes;
    }
    goto LAB_00164ff8;
  case enum_type:
    iVar7._M_current =
         (members->enums).
         super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>._M_impl
         .super__Vector_impl_data._M_finish;
    if (iVar7._M_current ==
        (members->enums).
        super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      pvVar6 = (vector<winmd::reader::TypeDef,std::allocator<winmd::reader::TypeDef>> *)
               &members->enums;
      goto LAB_00164fd1;
    }
    uVar2 = (type->super_row_base<winmd::reader::TypeDef>).m_index;
    uVar3 = *(undefined4 *)&(type->super_row_base<winmd::reader::TypeDef>).field_0xc;
    ((iVar7._M_current)->super_row_base<winmd::reader::TypeDef>).m_table =
         (type->super_row_base<winmd::reader::TypeDef>).m_table;
    ((iVar7._M_current)->super_row_base<winmd::reader::TypeDef>).m_index = uVar2;
    *(undefined4 *)&((iVar7._M_current)->super_row_base<winmd::reader::TypeDef>).field_0xc = uVar3;
    ppTVar1 = &(members->enums).
               super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppTVar1 = *ppTVar1 + 1;
    break;
  case struct_type:
    local_48.first._M_len = 0x1b;
    local_48.first._M_str = "Windows.Foundation.Metadata";
    local_28._M_len = 0x14;
    local_28._M_str = "ApiContractAttribute";
    CVar8 = get_attribute<winmd::reader::TypeDef>(type,&local_48.first,&local_28);
    if (CVar8.super_row_base<winmd::reader::CustomAttribute>.m_table == (table_base *)0x0) {
      iVar7._M_current =
           (members->structs).
           super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar7._M_current !=
          (members->structs).
          super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        uVar2 = (type->super_row_base<winmd::reader::TypeDef>).m_index;
        uVar3 = *(undefined4 *)&(type->super_row_base<winmd::reader::TypeDef>).field_0xc;
        ((iVar7._M_current)->super_row_base<winmd::reader::TypeDef>).m_table =
             (type->super_row_base<winmd::reader::TypeDef>).m_table;
        ((iVar7._M_current)->super_row_base<winmd::reader::TypeDef>).m_index = uVar2;
        *(undefined4 *)&((iVar7._M_current)->super_row_base<winmd::reader::TypeDef>).field_0xc =
             uVar3;
        ppTVar1 = &(members->structs).
                   super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppTVar1 = *ppTVar1 + 1;
        return;
      }
      pvVar6 = (vector<winmd::reader::TypeDef,std::allocator<winmd::reader::TypeDef>> *)
               &members->structs;
    }
    else {
      iVar7._M_current =
           (members->contracts).
           super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar7._M_current !=
          (members->contracts).
          super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        uVar2 = (type->super_row_base<winmd::reader::TypeDef>).m_index;
        uVar3 = *(undefined4 *)&(type->super_row_base<winmd::reader::TypeDef>).field_0xc;
        ((iVar7._M_current)->super_row_base<winmd::reader::TypeDef>).m_table =
             (type->super_row_base<winmd::reader::TypeDef>).m_table;
        ((iVar7._M_current)->super_row_base<winmd::reader::TypeDef>).m_index = uVar2;
        *(undefined4 *)&((iVar7._M_current)->super_row_base<winmd::reader::TypeDef>).field_0xc =
             uVar3;
        ppTVar1 = &(members->contracts).
                   super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppTVar1 = *ppTVar1 + 1;
        return;
      }
      pvVar6 = (vector<winmd::reader::TypeDef,std::allocator<winmd::reader::TypeDef>> *)
               &members->contracts;
    }
LAB_00164ff8:
    std::vector<winmd::reader::TypeDef,std::allocator<winmd::reader::TypeDef>>::
    _M_realloc_insert<winmd::reader::TypeDef_const&>(pvVar6,iVar7,type);
    break;
  case delegate_type:
    iVar7._M_current =
         (members->delegates).
         super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>._M_impl
         .super__Vector_impl_data._M_finish;
    if (iVar7._M_current ==
        (members->delegates).
        super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      pvVar6 = (vector<winmd::reader::TypeDef,std::allocator<winmd::reader::TypeDef>> *)
               &members->delegates;
      goto LAB_00164fd1;
    }
    uVar2 = (type->super_row_base<winmd::reader::TypeDef>).m_index;
    uVar3 = *(undefined4 *)&(type->super_row_base<winmd::reader::TypeDef>).field_0xc;
    ((iVar7._M_current)->super_row_base<winmd::reader::TypeDef>).m_table =
         (type->super_row_base<winmd::reader::TypeDef>).m_table;
    ((iVar7._M_current)->super_row_base<winmd::reader::TypeDef>).m_index = uVar2;
    *(undefined4 *)&((iVar7._M_current)->super_row_base<winmd::reader::TypeDef>).field_0xc = uVar3;
    ppTVar1 = &(members->delegates).
               super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppTVar1 = *ppTVar1 + 1;
  }
  return;
}

Assistant:

void add_type_to_members(TypeDef const& type, namespace_members& members)
        {
            switch (get_category(type))
            {
            case category::interface_type:
                members.interfaces.push_back(type);
                return;
            case category::class_type:
                if (extends_type(type, "System"sv, "Attribute"sv))
                {
                    members.attributes.push_back(type);
                    return;
                }
                members.classes.push_back(type);
                return;
            case category::enum_type:
                members.enums.push_back(type);
                return;
            case category::struct_type:
                if (get_attribute(type, "Windows.Foundation.Metadata"sv, "ApiContractAttribute"sv))
                {
                    members.contracts.push_back(type);
                    return;
                }
                members.structs.push_back(type);
                return;
            case category::delegate_type:
                members.delegates.push_back(type);
                return;
            }
        }